

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpSocket.cpp
# Opt level: O2

void __thiscall mognetwork::TcpSocket::disconnect(TcpSocket *this)

{
  int in_ESI;
  ReadedDatas RStack_38;
  
  Socket::close(&this->super_Socket,in_ESI);
  std::__cxx11::
  list<std::vector<char,std::allocator<char>>*,std::allocator<std::vector<char,std::allocator<char>>*>>
  ::remove_if<bool(*)(std::vector<char,std::allocator<char>>*)>
            ((list<std::vector<char,std::allocator<char>>*,std::allocator<std::vector<char,std::allocator<char>>*>>
              *)&this->m_pendingDatas,deleteAll);
  ReadedDatas::ReadedDatas(&RStack_38);
  ReadedDatas::operator=(&this->m_pendingRDatas,&RStack_38);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&RStack_38.datas.super__Vector_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

void TcpSocket::disconnect()
  {
    close();
    m_pendingDatas.remove_if(deleteAll);
    m_pendingRDatas = ReadedDatas();
  }